

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void handle_shortcut_key(nes_system *system,SDL_Scancode key)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  int scale;
  int is_ctrl_down;
  uint8_t *keys;
  SDL_Scancode key_local;
  nes_system *system_local;
  
  lVar3 = SDL_GetKeyboardState(0);
  uVar1 = wnd_scale;
  if (*(char *)(lVar3 + 0xe0) != '\0' || *(char *)(lVar3 + 0xe4) != '\0') {
    if (key == SDL_SCANCODE_EQUALS) {
      wnd_scale = wnd_scale + 1;
    }
    else if (key == SDL_SCANCODE_MINUS) {
      wnd_scale = wnd_scale - 1;
    }
    if (uVar1 != wnd_scale) {
      SDL_SetWindowSize(wnd,wnd_scale << 8,wnd_scale * 0xe0);
    }
    if (key == SDL_SCANCODE_S) {
      if (state_buffer == (void *)0x0) {
        state_buffer_size = nes_system_get_state_size(system);
        state_buffer = malloc(state_buffer_size);
      }
      iVar2 = nes_system_save_state(system,state_buffer,state_buffer_size);
      if (iVar2 == 0) {
        fprintf(_stderr,"Save state failed\n");
      }
      write_save();
    }
    else if (key == SDL_SCANCODE_L) {
      read_save();
      if ((state_buffer != (void *)0x0) &&
         (iVar2 = nes_system_load_state(system,state_buffer,state_buffer_size), iVar2 == 0)) {
        fprintf(_stderr,"Load state failed\n");
      }
    }
    else if (key == SDL_SCANCODE_R) {
      nes_system_reset(system);
    }
  }
  return;
}

Assistant:

void handle_shortcut_key(nes_system* system, SDL_Scancode key)
{
    const uint8_t* keys = SDL_GetKeyboardState(0);
    int is_ctrl_down = keys[SDL_SCANCODE_LCTRL] | keys[SDL_SCANCODE_RCTRL];
    if (is_ctrl_down)
    {
        int scale = wnd_scale;
        if (key == SDL_SCANCODE_EQUALS) wnd_scale++;
        else if(key == SDL_SCANCODE_MINUS) wnd_scale--;

        if (scale != wnd_scale)
        {
            SDL_SetWindowSize(wnd, TEXTURE_WIDTH * wnd_scale, TEXTURE_HEIGHT * wnd_scale);
        }

        if (key == SDL_SCANCODE_S)
        {
            if (!state_buffer)
            {
                state_buffer_size   = nes_system_get_state_size(system);
                state_buffer        = malloc(state_buffer_size);
            }

            if (!nes_system_save_state(system, state_buffer, state_buffer_size))
                fprintf(stderr, "Save state failed\n");

            write_save();
        }
        else if (key == SDL_SCANCODE_L)
        {
            read_save();

            if (state_buffer)
            {
                if (!nes_system_load_state(system, state_buffer, state_buffer_size))
                    fprintf(stderr, "Load state failed\n");
            }
        }
        else if (key == SDL_SCANCODE_R)
        {
            nes_system_reset(system);
        }
    }
}